

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

Matrix * GetCameraMatrix2D(Camera2D camera)

{
  Matrix *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  
  in_RDI->m3 = 0.0;
  in_RDI->m7 = 0.0;
  in_RDI->m11 = 0.0;
  in_RDI->m15 = 0.0;
  in_RDI->m2 = 0.0;
  in_RDI->m6 = 0.0;
  in_RDI->m10 = 0.0;
  in_RDI->m14 = 0.0;
  in_RDI->m1 = 0.0;
  in_RDI->m5 = 0.0;
  in_RDI->m9 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m0 = 0.0;
  in_RDI->m4 = 0.0;
  in_RDI->m8 = 0.0;
  in_RDI->m12 = 0.0;
  fVar1 = -in_stack_00000010;
  fVar2 = sinf(in_stack_00000018 * 0.017453292);
  fVar3 = cosf(in_stack_00000018 * 0.017453292);
  fVar17 = in_stack_0000001c * 0.0 + 0.0;
  fVar5 = fVar17 + 0.0;
  fVar6 = (fVar5 * fVar1 - fVar17 * in_stack_00000014) + 0.0 + 1.0;
  fVar8 = (1.0 - fVar3) * 0.0;
  fVar18 = fVar8 - fVar2 * 0.0;
  fVar4 = fVar2 * 0.0 + fVar8;
  fVar20 = (1.0 - fVar3) + fVar3;
  fVar9 = (fVar8 - fVar2) * 0.0;
  fVar29 = in_stack_0000001c * (fVar8 + fVar3);
  fVar14 = (fVar8 + fVar3) * 0.0;
  fVar12 = (fVar8 + fVar2) * 0.0;
  fVar10 = fVar9 + fVar14;
  fVar13 = fVar12 + fVar14;
  fVar15 = fVar4 * 0.0;
  fVar31 = fVar18 * 0.0;
  fVar16 = fVar20 * 0.0;
  fVar20 = fVar20 + fVar31 + fVar15;
  fVar23 = fVar29 + fVar9 + fVar15 + 0.0;
  fVar7 = (fVar8 - fVar2) * in_stack_0000001c + fVar14 + fVar15 + 0.0;
  fVar9 = fVar4 + fVar10 + 0.0;
  fVar3 = fVar9 * 0.0;
  fVar11 = fVar10 + fVar15 + 0.0;
  fVar24 = (fVar23 * fVar1 - fVar7 * in_stack_00000014) + fVar3 + fVar11;
  fVar11 = fVar11 * 0.0;
  fVar22 = fVar23 + fVar7 * 0.0 + fVar3 + fVar11;
  fVar3 = fVar23 * 0.0 + fVar7 + fVar3 + fVar11;
  fVar11 = fVar23 * 0.0 + fVar7 * 0.0 + fVar9 + fVar11;
  fVar2 = in_stack_0000001c * (fVar8 + fVar2) + fVar14 + fVar31 + 0.0;
  fVar8 = fVar29 + fVar12 + fVar31 + 0.0;
  fVar9 = fVar18 + fVar13 + 0.0;
  fVar7 = fVar9 * 0.0;
  fVar23 = fVar13 + fVar31 + 0.0;
  fVar29 = (fVar2 * fVar1 - fVar8 * in_stack_00000014) + fVar7 + fVar23;
  fVar23 = fVar23 * 0.0;
  fVar14 = fVar2 + fVar8 * 0.0 + fVar7 + fVar23;
  fVar28 = fVar2 * 0.0 + fVar8 + fVar7 + fVar23;
  fVar23 = fVar2 * 0.0 + fVar8 * 0.0 + fVar9 + fVar23;
  fVar2 = in_stack_0000001c * fVar18 + fVar15 + fVar16 + 0.0;
  fVar9 = in_stack_0000001c * fVar4 + fVar31 + fVar16 + 0.0;
  fVar4 = fVar20 * 0.0;
  fVar32 = fVar31 + fVar15 + fVar16 + 0.0;
  fVar1 = (fVar2 * fVar1 - fVar9 * in_stack_00000014) + fVar4 + fVar32;
  fVar32 = fVar32 * 0.0;
  fVar13 = fVar2 + fVar9 * 0.0 + fVar4 + fVar32;
  fVar31 = fVar2 * 0.0 + fVar9 + fVar4 + fVar32;
  fVar32 = fVar2 * 0.0 + fVar9 * 0.0 + fVar20 + fVar32;
  fVar7 = fVar5 + fVar17 * 0.0;
  fVar20 = fVar14 * 0.0;
  fVar2 = fVar13 * 0.0;
  fVar21 = fVar22 * 0.0;
  fVar18 = fVar21 + fVar20;
  fVar15 = fVar5 * 0.0 + fVar17 + 0.0;
  fVar4 = fVar28 * 0.0;
  fVar30 = fVar31 * 0.0;
  fVar8 = fVar3 * 0.0;
  fVar10 = fVar8 + fVar4;
  fVar12 = fVar5 * 0.0 + fVar17 * 0.0 + 0.0;
  fVar9 = fVar23 * 0.0;
  fVar19 = fVar32 * 0.0;
  fVar16 = fVar11 * 0.0;
  fVar17 = fVar16 + fVar9;
  fVar5 = fVar29 * 0.0;
  fVar27 = fVar1 * 0.0;
  fVar25 = fVar24 * 0.0;
  fVar26 = fVar25 + fVar5;
  in_RDI->m0 = fVar7 * in_stack_00000008 + fVar22 + fVar20 + fVar2;
  in_RDI->m4 = fVar15 * in_stack_00000008 + fVar3 + fVar4 + fVar30;
  in_RDI->m8 = fVar12 * in_stack_00000008 + fVar11 + fVar9 + fVar19;
  in_RDI->m12 = in_stack_00000008 * fVar6 + fVar24 + fVar5 + fVar27;
  in_RDI->m1 = fVar7 * in_stack_0000000c + fVar14 + fVar21 + fVar2;
  in_RDI->m5 = fVar15 * in_stack_0000000c + fVar28 + fVar8 + fVar30;
  in_RDI->m9 = fVar12 * in_stack_0000000c + fVar23 + fVar16 + fVar19;
  in_RDI->m13 = in_stack_0000000c * fVar6 + fVar29 + fVar25 + fVar27;
  in_RDI->m2 = fVar7 * 0.0 + fVar13 + fVar18;
  in_RDI->m6 = fVar15 * 0.0 + fVar31 + fVar10;
  in_RDI->m10 = fVar12 * 0.0 + fVar32 + fVar17;
  in_RDI->m14 = fVar6 * 0.0 + fVar1 + fVar26;
  in_RDI->m3 = fVar18 + fVar2 + fVar7;
  in_RDI->m7 = fVar10 + fVar30 + fVar15;
  in_RDI->m11 = fVar17 + fVar19 + fVar12;
  in_RDI->m15 = fVar26 + fVar27 + fVar6;
  return in_RDI;
}

Assistant:

Matrix GetCameraMatrix2D(Camera2D camera)
{
    Matrix matTransform = { 0 };
    // The camera in world-space is set by
    //   1. Move it to target
    //   2. Rotate by -rotation and scale by (1/zoom)
    //      When setting higher scale, it's more intuitive for the world to become bigger (= camera become smaller),
    //      not for the camera getting bigger, hence the invert. Same deal with rotation
    //   3. Move it by (-offset);
    //      Offset defines target transform relative to screen, but since we're effectively "moving" screen (camera)
    //      we need to do it into opposite direction (inverse transform)

    // Having camera transform in world-space, inverse of it gives the modelview transform
    // Since (A*B*C)' = C'*B'*A', the modelview is
    //   1. Move to offset
    //   2. Rotate and Scale
    //   3. Move by -target
    Matrix matOrigin = MatrixTranslate(-camera.target.x, -camera.target.y, 0.0f);
    Matrix matRotation = MatrixRotate((Vector3){ 0.0f, 0.0f, 1.0f }, camera.rotation*DEG2RAD);
    Matrix matScale = MatrixScale(camera.zoom, camera.zoom, 1.0f);
    Matrix matTranslation = MatrixTranslate(camera.offset.x, camera.offset.y, 0.0f);

    matTransform = MatrixMultiply(MatrixMultiply(matOrigin, MatrixMultiply(matScale, matRotation)), matTranslation);

    return matTransform;
}